

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t run_container_write(run_container_t *container,char *buf)

{
  *(short *)buf = (short)container->n_runs;
  memcpy(buf + 2,container->runs,(long)container->n_runs << 2);
  return container->n_runs * 4 + 2;
}

Assistant:

int32_t run_container_write(const run_container_t *container, char *buf) {
    uint16_t cast_16 = container->n_runs;
    memcpy(buf, &cast_16, sizeof(uint16_t));
    memcpy(buf + sizeof(uint16_t), container->runs,
           container->n_runs * sizeof(rle16_t));
    return run_container_size_in_bytes(container);
}